

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser * init_parse_player_prop(void)

{
  parser *p_00;
  parser *p;
  
  p_00 = parser_new();
  parser_setpriv(p_00,(void *)0x0);
  parser_reg(p_00,"type str type",parse_player_prop_type);
  parser_reg(p_00,"code str code",parse_player_prop_code);
  parser_reg(p_00,"desc str desc",parse_player_prop_desc);
  parser_reg(p_00,"name str desc",parse_player_prop_name);
  parser_reg(p_00,"value int value",parse_player_prop_value);
  parser_reg(p_00,"bindui sym ui int aux sym uival",parse_player_prop_bindui);
  return p_00;
}

Assistant:

static struct parser *init_parse_player_prop(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);
	parser_reg(p, "type str type", parse_player_prop_type);
	parser_reg(p, "code str code", parse_player_prop_code);
	parser_reg(p, "desc str desc", parse_player_prop_desc);
	parser_reg(p, "name str desc", parse_player_prop_name);
	parser_reg(p, "value int value", parse_player_prop_value);
	parser_reg(p, "bindui sym ui int aux sym uival", parse_player_prop_bindui);
	return p;
}